

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

int __thiscall
cmCTest::RunTest(cmCTest *this,vector<const_char_*,_std::allocator<const_char_*>_> *argv,
                string *output,int *retVal,ostream *log,cmDuration testTimeOut,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *environment,Encoding encoding)

{
  _Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false> _Var1;
  pointer pbVar2;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var3;
  pointer ppcVar4;
  char *__s;
  _Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false> this_00;
  char cVar5;
  char cVar6;
  bool bVar7;
  uint __val;
  int iVar8;
  int iVar9;
  ostream *poVar10;
  string *psVar11;
  SaveRestoreEnvironment *pSVar12;
  cmsysProcess *pcVar13;
  size_t sVar14;
  pointer __dest;
  uint uVar15;
  ulong uVar16;
  pointer ppcVar17;
  pointer __p;
  cmDuration cVar18;
  cmProcessOutput processOutput;
  string outerr;
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  saveEnv;
  vector<char,_std::allocator<char>_> tempOutput;
  int length;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  char *data;
  string strdata;
  ostringstream cmCTestLog_msg;
  undefined1 auStack_418 [15];
  cmProcessOutput local_409;
  cmsysProcess *local_408;
  cmCTest *local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  _Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false> local_3d8;
  cmDuration local_3d0;
  vector<char,_std::allocator<char>_> local_3c8;
  undefined4 local_3b0;
  int local_3ac;
  undefined1 local_3a8 [40];
  int *local_380;
  vector<char,_std::allocator<char>_> local_378;
  char *local_358;
  string *local_350;
  ostream *local_348;
  undefined1 local_340 [16];
  SaveRestoreEnvironment local_330 [4];
  ios_base local_2d0 [264];
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [6];
  ios_base local_158 [264];
  string local_50;
  
  if (environment ==
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    local_3b0 = 0;
  }
  else {
    pbVar2 = (environment->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_3b0 = (undefined4)
                CONCAT71((int7)((ulong)pbVar2 >> 8),
                         pbVar2 != (environment->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish);
  }
  local_408 = (cmsysProcess *)testTimeOut.__r;
  local_400 = this;
  cVar18 = cmCTestScriptHandler::GetRemainingTimeAllowed
                     (&((this->Impl)._M_t.
                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                        .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                       ScriptHandler);
  local_3d0.__r =
       (rep_conflict)
       (~-(ulong)(cVar18.__r != 10000000.0) & (ulong)cVar18.__r |
       (ulong)(cVar18.__r + -120.0) & -(ulong)(cVar18.__r != 10000000.0));
  _Var3._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  cVar18.__r = ((_Var3._M_head_impl)->TimeOut).__r;
  if ((0.0 < cVar18.__r) && (cVar18.__r < local_3d0.__r)) {
    local_3d0.__r = ((_Var3._M_head_impl)->TimeOut).__r;
  }
  if ((0.0 < (double)local_408) &&
     (cVar18 = cmCTestScriptHandler::GetRemainingTimeAllowed(&(_Var3._M_head_impl)->ScriptHandler),
     (double)local_408 < cVar18.__r)) {
    local_3d0.__r = (rep_conflict)local_408;
  }
  if (local_3d0.__r <= 0.0) {
    local_3d0.__r = 1.0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"Test timeout computed to be: ",0x1d);
  if ((local_3d0.__r != 10000000.0) || (NAN(local_3d0.__r))) {
    __val = cmDurationTo<unsigned_int>(&local_3d0);
    cVar6 = '\x01';
    if (9 < __val) {
      uVar15 = __val;
      cVar5 = '\x04';
      do {
        cVar6 = cVar5;
        if (uVar15 < 100) {
          cVar6 = cVar6 + -2;
          goto LAB_001501fb;
        }
        if (uVar15 < 1000) {
          cVar6 = cVar6 + -1;
          goto LAB_001501fb;
        }
        if (uVar15 < 10000) goto LAB_001501fb;
        bVar7 = 99999 < uVar15;
        uVar15 = uVar15 / 10000;
        cVar5 = cVar6 + '\x04';
      } while (bVar7);
      cVar6 = cVar6 + '\x01';
    }
LAB_001501fb:
    local_340._0_8_ = local_340 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_340,cVar6);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_340._0_8_,local_340._8_4_,__val);
  }
  else {
    local_340._0_8_ = (long)local_340 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"infinite","");
  }
  local_408 = (cmsysProcess *)environment;
  local_380 = retVal;
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c8,(char *)local_340._0_8_,local_340._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  _Var1._M_head_impl = (SaveRestoreEnvironment *)(local_340 + 0x10);
  if ((SaveRestoreEnvironment *)local_340._0_8_ != _Var1._M_head_impl) {
    operator_delete((void *)local_340._0_8_,
                    CONCAT71(local_330[0].Env.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             local_330[0].Env.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_1_) + 1);
  }
  std::__cxx11::stringbuf::str();
  Log(local_400,5,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
      ,0x4b3,(char *)local_340._0_8_,false);
  if ((SaveRestoreEnvironment *)local_340._0_8_ != _Var1._M_head_impl) {
    operator_delete((void *)local_340._0_8_,
                    CONCAT71(local_330[0].Env.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             local_330[0].Env.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_1_) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,
             *(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
              super__Vector_impl_data._M_start,(allocator<char> *)local_340);
  psVar11 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  bVar7 = cmsys::SystemTools::SameFile((string *)local_1c8,psVar11);
  if (bVar7) {
    bVar7 = ((local_400->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ForceNewCTestProcess;
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
    }
    if (bVar7 == false) {
      cmCTest((cmCTest *)&local_3c8);
      std::__cxx11::string::_M_assign
                ((string *)
                 (local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start + 8));
      *(rep_conflict *)
       (local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start + 0x22c8) = local_3d0.__r;
      local_350 = output;
      local_348 = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      *(ostringstream **)
       (local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start + 0x2340) = (ostringstream *)local_1c8;
      *(ostringstream **)
       (local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start + 0x2348) = (ostringstream *)local_1c8;
      local_3a8._0_8_ = (pointer)0x0;
      local_3a8._8_8_ = (pointer)0x0;
      local_3a8._16_8_ = (pointer)0x0;
      ppcVar17 = (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      ppcVar4 = (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppcVar17 != ppcVar4) {
        do {
          local_3d8._M_head_impl = (SaveRestoreEnvironment *)*ppcVar17;
          if (local_3d8._M_head_impl != (SaveRestoreEnvironment *)0x0) {
            iVar8 = strcmp((char *)local_3d8._M_head_impl,"--build-generator");
            if ((iVar8 == 0) &&
               (((local_3d0.__r != 10000000.0 || (NAN(local_3d0.__r))) && (0.0 < local_3d0.__r)))) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const(&)[15]>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_3a8,(char (*) [15])"--test-timeout");
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
              cmDurationTo<unsigned_int>(&local_3d0);
              std::ostream::_M_insert<unsigned_long>((ulong)local_340);
              std::__cxx11::stringbuf::str();
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         local_3a8,&local_3f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
                operator_delete(local_3f8._M_dataplus._M_p,
                                local_3f8.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
              std::ios_base::~ios_base(local_2d0);
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_3a8,(char **)&local_3d8);
          }
          ppcVar17 = ppcVar17 + 1;
        } while (ppcVar17 != ppcVar4);
      }
      poVar10 = local_348;
      if (local_348 != (ostream *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_348,"* Run internal CTest",0x14);
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
      }
      psVar11 = local_350;
      local_3d8._M_head_impl = (SaveRestoreEnvironment *)0x0;
      if ((char)local_3b0 != '\0') {
        pSVar12 = (SaveRestoreEnvironment *)operator_new(0x18);
        cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(pSVar12);
        _Var1._M_head_impl = local_3d8._M_head_impl;
        local_340._0_8_ =
             (__uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
              )0x0;
        bVar7 = local_3d8._M_head_impl != (SaveRestoreEnvironment *)0x0;
        local_3d8._M_head_impl = pSVar12;
        if (bVar7) {
          cmSystemTools::SaveRestoreEnvironment::~SaveRestoreEnvironment(_Var1._M_head_impl);
          operator_delete(_Var1._M_head_impl,0x18);
        }
        std::
        unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
        ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                       *)local_340);
        cmSystemTools::AppendEnv
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_408);
      }
      iVar8 = Run((cmCTest *)&local_3c8,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3a8,psVar11);
      *local_380 = iVar8;
      if (psVar11 != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)psVar11,local_340._0_8_);
        if (local_340._0_8_ != (long)local_340 + 0x10) {
          operator_delete((void *)local_340._0_8_,
                          CONCAT71(local_330[0].Env.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                   local_330[0].Env.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_1_) + 1);
        }
      }
      if (poVar10 != (ostream *)0x0 && psVar11 != (string *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
      }
      if (psVar11 != (string *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_340,"Internal cmCTest object used to run test.",0x29);
        std::ios::widen((char)(ostream *)local_340 +
                        (char)(((SaveRestoreEnvironment *)(local_340._0_8_ + -0x18))->Env).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        std::ostream::put((char)local_340);
        poVar10 = (ostream *)std::ostream::flush();
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(local_400,5,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
            ,0x4e4,local_3f8._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
        std::ios_base::~ios_base(local_2d0);
      }
      std::
      unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                     *)&local_3d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      std::ios_base::~ios_base(local_158);
      if (*(long **)(local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start + 0x2398) != (long *)0x0) {
        (**(code **)(**(long **)(local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start + 0x2398) + 8))();
      }
      std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::~unique_ptr
                ((unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_> *)&local_3c8)
      ;
      return 4;
    }
  }
  else if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
  }
  local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (output != (string *)0x0) {
    output->_M_string_length = 0;
    *(output->_M_dataplus)._M_p = '\0';
  }
  local_3d8._M_head_impl = (SaveRestoreEnvironment *)0x0;
  if ((char)local_3b0 != '\0') {
    pSVar12 = (SaveRestoreEnvironment *)operator_new(0x18);
    cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(pSVar12);
    this_00._M_head_impl = local_3d8._M_head_impl;
    local_1c8._0_8_ = (_func_int **)0x0;
    bVar7 = local_3d8._M_head_impl != (SaveRestoreEnvironment *)0x0;
    local_3d8._M_head_impl = pSVar12;
    if (bVar7) {
      cmSystemTools::SaveRestoreEnvironment::~SaveRestoreEnvironment(this_00._M_head_impl);
      operator_delete(this_00._M_head_impl,0x18);
    }
    std::
    unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
    ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                   *)local_1c8);
    cmSystemTools::AppendEnv
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_408);
  }
  pcVar13 = cmsysProcess_New();
  cmsysProcess_SetCommand
            (pcVar13,(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl
                     .super__Vector_impl_data._M_start);
  local_408 = pcVar13;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"Command is: ",0xc);
  __s = *(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
         super__Vector_impl_data._M_start;
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_418 + (long)*(_func_int **)(local_1c8._0_8_ + -0x18)) + 0x250);
  }
  else {
    sVar14 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,__s,sVar14);
  }
  std::ios::widen((char)(ostream *)local_1c8 + (char)*(_func_int **)(local_1c8._0_8_ + -0x18));
  std::ostream::put((char)local_1c8);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_400,0,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
      ,0x4f6,(char *)local_340._0_8_,false);
  if ((SaveRestoreEnvironment *)local_340._0_8_ != _Var1._M_head_impl) {
    operator_delete((void *)local_340._0_8_,
                    CONCAT71(local_330[0].Env.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             local_330[0].Env.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_1_) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  pcVar13 = local_408;
  if (cmSystemTools::s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(local_408,0,1);
  }
  cmsysProcess_SetTimeout(pcVar13,local_3d0.__r);
  cmsysProcess_Execute(pcVar13);
  cmProcessOutput::cmProcessOutput(&local_409,encoding,0x400);
  local_340._8_8_ = 0;
  local_330[0].Env.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = '\0';
  local_340._0_8_ = _Var1._M_head_impl;
  while (iVar8 = cmsysProcess_WaitForData(local_408,&local_358,&local_3ac,(double *)0x0), iVar8 != 0
        ) {
    cmProcessOutput::DecodeText(&local_409,local_358,(long)local_3ac,(string *)local_340,0);
    if (output != (string *)0x0) {
      std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                ((vector<char,std::allocator<char>> *)&local_3c8,
                 local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,local_358,local_358 + local_3ac);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    if (local_340._8_8_ != 0) {
      std::ostream::write((char *)local_1c8,local_340._0_8_);
      std::ostream::flush();
    }
    std::__cxx11::stringbuf::str();
    Log(local_400,5,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
        ,0x508,local_3f8._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
    if (log != (ostream *)0x0) {
      std::ostream::write((char *)log,local_340._0_8_);
    }
  }
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  cmProcessOutput::DecodeText(&local_409,&local_50,(string *)local_340,0);
  pcVar13 = local_408;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if (local_340._8_8_ != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    if (local_340._8_8_ != 0) {
      std::ostream::write(local_1c8,local_340._0_8_);
      std::ostream::flush();
    }
    std::__cxx11::stringbuf::str();
    Log(local_400,5,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
        ,0x510,local_3f8._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
    if (log != (ostream *)0x0) {
      std::ostream::write((char *)log,local_340._0_8_);
    }
  }
  cmsysProcess_WaitForExit(pcVar13,(double *)0x0);
  local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar16 = (long)local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar16 == 0) {
    __dest = (pointer)0x0;
  }
  else {
    if ((long)uVar16 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = (pointer)operator_new(uVar16);
  }
  local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = __dest + uVar16;
  sVar14 = (long)local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = __dest;
  if (sVar14 != 0) {
    local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = __dest;
    memmove(__dest,local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar14);
  }
  local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = __dest + sVar14;
  cmProcessOutput::DecodeText(&local_409,&local_378,&local_3c8,0);
  if (local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_378.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((output != (string *)0x0) &&
     (local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    std::__cxx11::string::append
              ((char *)output,
               (ulong)local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"-- Process completed",0x14);
  std::ios::widen((char)(ostream *)local_1c8 + (char)*(_func_int **)(local_1c8._0_8_ + -0x18));
  std::ostream::put((char)local_1c8);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_400,5,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
      ,0x51c,local_3f8._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  iVar8 = cmsysProcess_GetState(pcVar13);
  if (iVar8 == 1) {
    local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3f8,"\n*** ERROR executing: ","");
    cmsysProcess_GetErrorString(local_408);
    std::__cxx11::string::append((char *)&local_3f8);
    if (output != (string *)0x0) {
      std::__cxx11::string::_M_append((char *)output,(ulong)local_3f8._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8,local_3f8._M_dataplus._M_p,local_3f8._M_string_length)
    ;
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_400,5,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
        ,0x53a,(char *)local_3a8._0_8_,false);
  }
  else {
    if (iVar8 != 2) {
      if (iVar8 == 4) {
        iVar9 = cmsysProcess_GetExitValue(local_408);
        *local_380 = iVar9;
        if ((iVar9 != 0) &&
           (((local_400->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
            OutputTestOutputOnTestFailure == true)) {
          OutputTestErrors(local_400,&local_3c8);
        }
      }
      goto LAB_001510ca;
    }
    if (((local_400->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
        OutputTestOutputOnTestFailure == true) {
      OutputTestErrors(local_400,&local_3c8);
    }
    iVar9 = cmsysProcess_GetExitException(local_408);
    *local_380 = iVar9;
    local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3f8,"\n*** Exception executing: ","");
    cmsysProcess_GetExceptionString(local_408);
    std::__cxx11::string::append((char *)&local_3f8);
    if (output != (string *)0x0) {
      std::__cxx11::string::_M_append((char *)output,(ulong)local_3f8._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8,local_3f8._M_dataplus._M_p,local_3f8._M_string_length)
    ;
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_400,5,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
        ,0x531,(char *)local_3a8._0_8_,false);
  }
  if ((pointer)local_3a8._0_8_ != (pointer)(local_3a8 + 0x10)) {
    operator_delete((void *)local_3a8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_3a8._16_8_)->_M_p + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
LAB_001510ca:
  cmsysProcess_Delete(local_408);
  if ((SaveRestoreEnvironment *)local_340._0_8_ != (SaveRestoreEnvironment *)(local_340 + 0x10)) {
    operator_delete((void *)local_340._0_8_,
                    CONCAT71(local_330[0].Env.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             local_330[0].Env.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_1_) + 1);
  }
  cmProcessOutput::~cmProcessOutput(&local_409);
  std::
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                 *)&local_3d8);
  if (local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar8;
}

Assistant:

int cmCTest::RunTest(std::vector<const char*> argv, std::string* output,
                     int* retVal, std::ostream* log, cmDuration testTimeOut,
                     std::vector<std::string>* environment, Encoding encoding)
{
  bool modifyEnv = (environment && !environment->empty());

  // determine how much time we have
  cmDuration timeout = this->GetRemainingTimeAllowed();
  if (timeout != cmCTest::MaxDuration()) {
    timeout -= std::chrono::minutes(2);
  }
  if (this->Impl->TimeOut > cmDuration::zero() &&
      this->Impl->TimeOut < timeout) {
    timeout = this->Impl->TimeOut;
  }
  if (testTimeOut > cmDuration::zero() &&
      testTimeOut < this->GetRemainingTimeAllowed()) {
    timeout = testTimeOut;
  }

  // always have at least 1 second if we got to here
  if (timeout <= cmDuration::zero()) {
    timeout = std::chrono::seconds(1);
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "Test timeout computed to be: "
               << (timeout == cmCTest::MaxDuration()
                     ? std::string("infinite")
                     : std::to_string(cmDurationTo<unsigned int>(timeout)))
               << "\n");
  if (cmSystemTools::SameFile(argv[0], cmSystemTools::GetCTestCommand()) &&
      !this->Impl->ForceNewCTestProcess) {
    cmCTest inst;
    inst.Impl->ConfigType = this->Impl->ConfigType;
    inst.Impl->TimeOut = timeout;

    // Capture output of the child ctest.
    std::ostringstream oss;
    inst.SetStreams(&oss, &oss);

    std::vector<std::string> args;
    for (char const* i : argv) {
      if (i) {
        // make sure we pass the timeout in for any build and test
        // invocations. Since --build-generator is required this is a
        // good place to check for it, and to add the arguments in
        if (strcmp(i, "--build-generator") == 0 &&
            timeout != cmCTest::MaxDuration() &&
            timeout > cmDuration::zero()) {
          args.emplace_back("--test-timeout");
          std::ostringstream msg;
          msg << cmDurationTo<unsigned int>(timeout);
          args.push_back(msg.str());
        }
        args.emplace_back(i);
      }
    }
    if (log) {
      *log << "* Run internal CTest" << std::endl;
    }

    std::unique_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
    if (modifyEnv) {
      saveEnv = cm::make_unique<cmSystemTools::SaveRestoreEnvironment>();
      cmSystemTools::AppendEnv(*environment);
    }

    *retVal = inst.Run(args, output);
    if (output) {
      *output += oss.str();
    }
    if (log && output) {
      *log << *output;
    }
    if (output) {
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 "Internal cmCTest object used to run test." << std::endl
                                                             << *output
                                                             << std::endl);
    }

    return cmsysProcess_State_Exited;
  }
  std::vector<char> tempOutput;
  if (output) {
    output->clear();
  }

  std::unique_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
  if (modifyEnv) {
    saveEnv = cm::make_unique<cmSystemTools::SaveRestoreEnvironment>();
    cmSystemTools::AppendEnv(*environment);
  }

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmCTestLog(this, DEBUG, "Command is: " << argv[0] << std::endl);
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }

  cmsysProcess_SetTimeout(cp, timeout.count());
  cmsysProcess_Execute(cp);

  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while (cmsysProcess_WaitForData(cp, &data, &length, nullptr)) {
    processOutput.DecodeText(data, length, strdata);
    if (output) {
      cmAppend(tempOutput, data, data + length);
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (log) {
      log->write(strdata.c_str(), strdata.size());
    }
  }
  processOutput.DecodeText(std::string(), strdata);
  if (!strdata.empty()) {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (log) {
      log->write(strdata.c_str(), strdata.size());
    }
  }

  cmsysProcess_WaitForExit(cp, nullptr);
  processOutput.DecodeText(tempOutput, tempOutput);
  if (output && tempOutput.begin() != tempOutput.end()) {
    output->append(tempOutput.data(), tempOutput.size());
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "-- Process completed" << std::endl);

  int result = cmsysProcess_GetState(cp);

  if (result == cmsysProcess_State_Exited) {
    *retVal = cmsysProcess_GetExitValue(cp);
    if (*retVal != 0 && this->Impl->OutputTestOutputOnTestFailure) {
      OutputTestErrors(tempOutput);
    }
  } else if (result == cmsysProcess_State_Exception) {
    if (this->Impl->OutputTestOutputOnTestFailure) {
      OutputTestErrors(tempOutput);
    }
    *retVal = cmsysProcess_GetExitException(cp);
    std::string outerr = "\n*** Exception executing: ";
    outerr += cmsysProcess_GetExceptionString(cp);
    if (output) {
      *output += outerr;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               outerr << std::endl
                      << std::flush);
  } else if (result == cmsysProcess_State_Error) {
    std::string outerr = "\n*** ERROR executing: ";
    outerr += cmsysProcess_GetErrorString(cp);
    if (output) {
      *output += outerr;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               outerr << std::endl
                      << std::flush);
  }
  cmsysProcess_Delete(cp);

  return result;
}